

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

Vec_Ptr_t * Aig_ManDfsArray(Aig_Man_t *p,Aig_Obj_t **pNodes,int nNodes)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  int iVar4;
  ulong uVar5;
  
  Aig_ManIncrementTravId(p);
  iVar1 = p->vObjs->nSize;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar4;
  if (iVar4 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar4 << 3);
  }
  vNodes->pArray = ppvVar3;
  pAVar2 = p->pConst1;
  pAVar2->TravId = p->nTravIds;
  if (iVar4 == 0) {
    if (ppvVar3 == (void **)0x0) {
      ppvVar3 = (void **)malloc(0x80);
    }
    else {
      ppvVar3 = (void **)realloc(ppvVar3,0x80);
    }
    vNodes->pArray = ppvVar3;
    vNodes->nCap = 0x10;
  }
  vNodes->nSize = 1;
  *vNodes->pArray = pAVar2;
  if (0 < nNodes) {
    uVar5 = 0;
    do {
      Aig_ManDfsAll_rec(p,pNodes[uVar5],vNodes);
      uVar5 = uVar5 + 1;
    } while ((uint)nNodes != uVar5);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsArray( Aig_Man_t * p, Aig_Obj_t ** pNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    Aig_ManIncrementTravId( p );
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // add constant
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    for ( i = 0; i < nNodes; i++ )
        Aig_ManDfsAll_rec( p, pNodes[i], vNodes );
    return vNodes;
}